

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFileLocation.cxx
# Opt level: O1

bool __thiscall
cmSourceFileLocation::MatchesAmbiguousExtension
          (cmSourceFileLocation *this,cmSourceFileLocation *loc)

{
  string *psVar1;
  ulong __n;
  ulong __n_00;
  char *__s1;
  int iVar2;
  cmake *pcVar3;
  const_iterator cVar4;
  bool bVar5;
  key_type local_50;
  
  if (this->Makefile == (cmMakefile *)0x0) {
    __assert_fail("this->Makefile",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmSourceFileLocation.cxx"
                  ,0x8a,
                  "bool cmSourceFileLocation::MatchesAmbiguousExtension(const cmSourceFileLocation &) const"
                 );
  }
  psVar1 = &this->Name;
  __n = (this->Name)._M_string_length;
  __n_00 = (loc->Name)._M_string_length;
  if (__n == __n_00) {
    if (__n == 0) {
      return true;
    }
    iVar2 = bcmp((psVar1->_M_dataplus)._M_p,(loc->Name)._M_dataplus._M_p,__n);
    if (iVar2 == 0) {
      return true;
    }
  }
  if (((__n <= __n_00) || (__s1 = (psVar1->_M_dataplus)._M_p, __s1[__n_00] != '.')) ||
     (iVar2 = strncmp(__s1,(loc->Name)._M_dataplus._M_p,__n_00), iVar2 != 0)) {
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_50,(ulong)psVar1);
  pcVar3 = cmMakefile::GetCMakeInstance(this->Makefile);
  cVar4 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::find(&(pcVar3->SourceFileExtensionsSet)._M_h,&local_50);
  bVar5 = true;
  if (cVar4.
      super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(pcVar3->HeaderFileExtensionsSet)._M_h,&local_50);
    bVar5 = cVar4.
            super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            ._M_cur != (__node_type *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p == &local_50.field_2) {
    return bVar5;
  }
  operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  return bVar5;
}

Assistant:

bool cmSourceFileLocation::MatchesAmbiguousExtension(
  cmSourceFileLocation const& loc) const
{
  assert(this->Makefile);
  // This location's extension is not ambiguous but loc's extension
  // is.  See if the names match as-is.
  if (this->Name == loc.Name) {
    return true;
  }

  // Check if loc's name could possibly be extended to our name by
  // adding an extension.
  if (!(this->Name.size() > loc.Name.size() &&
        this->Name[loc.Name.size()] == '.' &&
        cmHasLiteralPrefixImpl(this->Name.c_str(), loc.Name.c_str(),
                               loc.Name.size()))) {
    return false;
  }

  // Only a fixed set of extensions will be tried to match a file on
  // disk.  One of these must match if loc refers to this source file.
  std::string const& ext = this->Name.substr(loc.Name.size() + 1);
  cmMakefile const* mf = this->Makefile;
  auto cm = mf->GetCMakeInstance();
  return cm->IsSourceExtension(ext) || cm->IsHeaderExtension(ext);
}